

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_atomic_binop_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  undefined1 component_type_00;
  Builder *pBVar1;
  CallInst *pCVar2;
  bool bVar3;
  Id IVar4;
  Id type_id;
  Value *pVVar5;
  Constant *this;
  APInt *this_00;
  uint64_t uVar6;
  Type *pTVar7;
  Operation *this_01;
  Operation *op;
  Op opcode;
  Id counter_ptr_id;
  Id IStack_60;
  ComponentType component_type;
  RawWidth width;
  Id coord;
  uint32_t i;
  BufferAccessInfo access;
  uint32_t num_coords;
  uint32_t num_coords_full;
  Id coords [3];
  AtomicBinOp binop;
  mapped_type *meta;
  Builder *pBStack_28;
  Id image_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  pCVar2 = instruction_local;
  pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar5,0);
  register0x00000000 =
       std::
       unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
       ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                     *)&instruction_local[0xf].super_Instruction.attachments._M_h._M_rehash_policy.
                        _M_next_resize,(key_type *)((long)&meta + 4));
  pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
  this = &LLVMBC::cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
  this_00 = LLVMBC::Constant::getUniqueInteger(this);
  uVar6 = LLVMBC::APInt::getZExtValue(this_00);
  coords[1]._3_1_ = (undefined1)uVar6;
  emit_buffer_synchronization_validation((Impl *)instruction_local,(CallInst *)builder,AtomicRMW);
  memset(&num_coords,0,0xc);
  pCVar2 = instruction_local;
  pBVar1 = builder;
  access.raw_vec_size = V1;
  access.index_id = 0;
  if (((stack0xffffffffffffffc8->kind == StructuredBuffer) ||
      (stack0xffffffffffffffc8->kind == RawBuffer)) ||
     (stack0xffffffffffffffc8->kind == TypedBuffer)) {
    IVar4 = stack0xffffffffffffffc8->index_offset_id;
    pTVar7 = LLVMBC::Value::getType((Value *)builder);
    _coord = build_buffer_access((Impl *)pCVar2,(CallInst *)pBVar1,1,IVar4,pTVar7,1);
    num_coords = coord;
    access.index_id = 1;
    access.raw_vec_size = V2;
  }
  else {
    bVar3 = get_image_dimensions
                      ((Impl *)instruction_local,meta._4_4_,&access.raw_vec_size,&access.index_id);
    if (!bVar3) {
      return false;
    }
    if (V4 < access.raw_vec_size) {
      return false;
    }
    for (width = B8; pCVar2 = instruction_local, width < access.raw_vec_size; width = width + B16) {
      pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,width + B64);
      IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar5,0);
      (&num_coords)[width] = IVar4;
    }
  }
  pCVar2 = instruction_local;
  IVar4 = spv::Builder::makeUintType(pBStack_28,0x20);
  IStack_60 = Converter::Impl::build_vector((Impl *)pCVar2,IVar4,&num_coords,access.raw_vec_size);
  pCVar2 = instruction_local;
  storage = stack0xffffffffffffffc8->storage;
  pTVar7 = LLVMBC::Value::getType((Value *)builder);
  counter_ptr_id = get_buffer_access_bits_per_component((Impl *)pCVar2,storage,pTVar7);
  if (counter_ptr_id == B64) {
    spv::Builder::addCapability(pBStack_28,CapabilityInt64Atomics);
  }
  IVar4 = emit_atomic_access_chain
                    ((Impl *)instruction_local,stack0xffffffffffffffc8,counter_ptr_id,meta._4_4_,
                     IStack_60,(ComponentType *)((long)&opcode + 3));
  if ((stack0xffffffffffffffc8->non_uniform & 1U) != 0) {
    spv::Builder::addDecoration(pBStack_28,IVar4,DecorationNonUniform,-1);
  }
  pCVar2 = instruction_local;
  pBVar1 = builder;
  switch(coords[1]._3_1_) {
  case 0:
    op._0_4_ = OpAtomicIAdd;
    break;
  case 1:
    op._0_4_ = OpAtomicAnd;
    break;
  case 2:
    op._0_4_ = OpAtomicOr;
    break;
  case 3:
    op._0_4_ = OpAtomicXor;
    break;
  case 4:
    op._0_4_ = OpAtomicSMin;
    break;
  case 5:
    op._0_4_ = OpAtomicSMax;
    break;
  case 6:
    op._0_4_ = OpAtomicUMin;
    break;
  case 7:
    op._0_4_ = OpAtomicUMax;
    break;
  case 8:
    op._0_4_ = OpAtomicExchange;
    break;
  default:
    return false;
  }
  type_id = Converter::Impl::get_type_id((Impl *)instruction_local,opcode._3_1_,1,1,false);
  this_01 = Converter::Impl::allocate((Impl *)pCVar2,(Op)op,(Value *)pBVar1,type_id);
  Operation::add_id(this_01,IVar4);
  IVar4 = spv::Builder::makeUintConstant(pBStack_28,1,false);
  Operation::add_id(this_01,IVar4);
  IVar4 = spv::Builder::makeUintConstant(pBStack_28,0,false);
  Operation::add_id(this_01,IVar4);
  pCVar2 = instruction_local;
  component_type_00 = opcode._3_1_;
  pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,6);
  IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar5,0);
  IVar4 = Converter::Impl::fixup_store_type_atomic((Impl *)pCVar2,component_type_00,1,IVar4);
  Operation::add_id(this_01,IVar4);
  Converter::Impl::add((Impl *)instruction_local,this_01,(bool)(stack0xffffffffffffffc8->rov & 1));
  Converter::Impl::fixup_load_type_atomic((Impl *)instruction_local,opcode._3_1_,1,(Value *)builder)
  ;
  return true;
}

Assistant:

bool emit_atomic_binop_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];
	auto binop = static_cast<DXIL::AtomicBinOp>(
	    llvm::cast<llvm::ConstantInt>(instruction->getOperand(2))->getUniqueInteger().getZExtValue());

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer || meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 1, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	}
	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	spv::Op opcode;

	switch (binop)
	{
	case DXIL::AtomicBinOp::Exchange:
		opcode = spv::OpAtomicExchange;
		break;

	case DXIL::AtomicBinOp::IAdd:
		opcode = spv::OpAtomicIAdd;
		break;

	case DXIL::AtomicBinOp::And:
		opcode = spv::OpAtomicAnd;
		break;

	case DXIL::AtomicBinOp::Or:
		opcode = spv::OpAtomicOr;
		break;

	case DXIL::AtomicBinOp::Xor:
		opcode = spv::OpAtomicXor;
		break;

	case DXIL::AtomicBinOp::IMin:
		opcode = spv::OpAtomicSMin;
		break;

	case DXIL::AtomicBinOp::IMax:
		opcode = spv::OpAtomicSMax;
		break;

	case DXIL::AtomicBinOp::UMin:
		opcode = spv::OpAtomicUMin;
		break;

	case DXIL::AtomicBinOp::UMax:
		opcode = spv::OpAtomicUMax;
		break;

	default:
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction, impl.get_type_id(component_type, 1, 1));

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(impl.fixup_store_type_atomic(component_type, 1, impl.get_id_for_value(instruction->getOperand(6))));

	impl.add(op, meta.rov);

	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}